

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::GLSL420Pack::Utils::getVariableName_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,SHADER_STAGES stage,VARIABLE_STORAGE storage,
          GLchar *variable_name)

{
  GLchar *text;
  GLchar *text_00;
  undefined4 in_register_0000000c;
  size_t position;
  size_t local_30;
  
  text = getVariableName::prefixes[stage][(ulong)this & 0xffffffff][0];
  text_00 = getVariableName::prefixes[stage][(ulong)this & 0xffffffff][1];
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"PRECEEDING_PREFIX_VARIABLE_NAME","");
  local_30 = 0;
  replaceToken("PRECEEDING",&local_30,text,__return_storage_ptr__);
  replaceToken("PREFIX",&local_30,text_00,__return_storage_ptr__);
  replaceToken("VARIABLE_NAME",&local_30,(GLchar *)CONCAT44(in_register_0000000c,storage),
               __return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getVariableName(SHADER_STAGES stage, VARIABLE_STORAGE storage, const glw::GLchar* variable_name)
{
	/* Variable name template */
	static const GLchar* variable_name_template = "PRECEEDING_PREFIX_VARIABLE_NAME";

	/* Tokens */
	static const GLchar* token_preceeding	= "PRECEEDING";
	static const GLchar* token_prefix		 = "PREFIX";
	static const GLchar* token_variable_name = "VARIABLE_NAME";

	static const GLchar* prefixes[Utils::STORAGE_MAX][Utils::SHADER_STAGES_MAX][2] = {
		/* COMPUTE,					VERTEX,				TCS,				TES,				GEOMETRY,			FRAGMENT					*/
		{ { "", "" },
		  { "in", "vs" },
		  { "vs", "tcs" },
		  { "tcs", "tes" },
		  { "tes", "gs" },
		  { "gs", "fs" } }, /* INPUT	*/
		{ { "", "" },
		  { "vs", "tcs" },
		  { "tcs", "tes" },
		  { "tes", "gs" },
		  { "gs", "fs" },
		  { "fs", "out" } }, /* OUTPUT	*/
		{ { "uni", "comp" },
		  { "uni", "vs" },
		  { "uni", "tcs" },
		  { "uni", "tes" },
		  { "uni", "gs" },
		  { "uni", "fs" } } /* UNIFORM	*/
	};

	/* Variables */
	const GLchar* preceeding = prefixes[storage][stage][0];
	const GLchar* prefix	 = prefixes[storage][stage][1];
	std::string   name		 = variable_name_template;
	size_t		  position   = 0;

	/* Replace tokens */
	Utils::replaceToken(token_preceeding, position, preceeding, name);
	Utils::replaceToken(token_prefix, position, prefix, name);
	Utils::replaceToken(token_variable_name, position, variable_name, name);

	/* Done */
	return name;
}